

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::HighestCeilingAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  double dVar1;
  uint uVar2;
  subsector_t *psVar3;
  double y;
  double dVar4;
  double x;
  
  x = p->X;
  y = p->Y;
  if ((this->planes[1].Flags & 0x1d0U) == 0x100) {
    dVar4 = -3.4028234663852886e+38;
    do {
      uVar2 = this->Portals[1];
      dVar1 = sectorPortals.Array[uVar2].mPlaneZ;
      if (dVar1 <= dVar4) break;
      x = x + sectorPortals.Array[uVar2].mDisplacement.X;
      y = y + sectorPortals.Array[uVar2].mDisplacement.Y;
      psVar3 = P_PointInSubsector(x,y);
      this = psVar3->sector;
      dVar4 = dVar1;
    } while ((this->planes[1].Flags & 0x1d0U) == 0x100);
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = this;
  }
  return (y * (this->ceilingplane).normal.Y +
         x * (this->ceilingplane).normal.X + (this->ceilingplane).D) * (this->ceilingplane).negiC;
}

Assistant:

double sector_t::HighestCeilingAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = -FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal below where we actually are.
	while (!check->PortalBlocksMovement(ceiling) && planeheight < check->GetPortalPlaneZ(ceiling))
	{
		pos += check->GetPortalDisplacement(ceiling);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->ceilingplane.ZatPoint(pos);
}